

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsMessageSetData(HelicsMessage message,void *data,int inputDataLength,HelicsError *err)

{
  size_t size;
  HelicsMessage pvVar1;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (message == (HelicsMessage)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001b013b;
    }
    else {
      pvVar1 = (HelicsMessage)0x0;
      if (*(short *)((long)message + 10) == 0xb3) {
        pvVar1 = message;
      }
      if (*(short *)((long)message + 10) == 0xb3 || err == (HelicsError *)0x0) goto LAB_001b013e;
    }
    err->error_code = -4;
    err->message = "The message object was not valid";
  }
LAB_001b013b:
  pvVar1 = (HelicsMessage)0x0;
LAB_001b013e:
  if (pvVar1 != (HelicsMessage)0x0) {
    size = (size_t)inputDataLength;
    if (*(void **)((long)pvVar1 + 0x60) == data) {
      *(size_t *)((long)pvVar1 + 0x50) = size;
    }
    else {
      helics::SmallBuffer::reserve((SmallBuffer *)((long)pvVar1 + 0x10),size);
      *(size_t *)((long)pvVar1 + 0x50) = size;
      if (inputDataLength != 0) {
        memcpy(*(void **)((long)pvVar1 + 0x60),data,size);
        return;
      }
    }
  }
  return;
}

Assistant:

void helicsMessageSetData(HelicsMessage message, const void* data, int inputDataLength, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    mess->data = std::string_view(static_cast<const char*>(data), inputDataLength);
}